

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O2

void __thiscall
rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::DoReserveMembers
          (GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this,SizeType newCapacity,
          CrtAllocator *allocator)

{
  uint uVar1;
  GenericMember<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *pGVar2;
  ObjectData *o;
  
  uVar1 = (this->data_).s.hashcode;
  if (uVar1 < newCapacity) {
    pGVar2 = Realloc<rapidjson::GenericMember<rapidjson::UTF8<char>,rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
                       (allocator,
                        (GenericMember<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
                        ((ulong)(this->data_).s.str & 0xffffffffffff),(ulong)uVar1,
                        (ulong)newCapacity);
    (this->data_).s.str = (Ch *)((ulong)(this->data_).f.flags << 0x30 | (ulong)pGVar2);
    (this->data_).s.hashcode = newCapacity;
  }
  return;
}

Assistant:

void DoReserveMembers(SizeType newCapacity, Allocator& allocator) {
        ObjectData& o = data_.o;
        if (newCapacity > o.capacity) {
            Member* newMembers = Realloc<Member>(allocator, GetMembersPointer(), o.capacity, newCapacity);
            RAPIDJSON_SETPOINTER(Member, o.members, newMembers);
            o.capacity = newCapacity;
        }
    }